

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

Status __thiscall leveldb::TableBuilder::Finish(TableBuilder *this)

{
  Rep *options;
  Comparator *pCVar1;
  Options *pOVar2;
  bool bVar3;
  TableBuilder *in_RSI;
  BlockHandle index_block_handle;
  BlockHandle metaindex_block_handle;
  BlockHandle filter_block_handle;
  string key;
  string handle_encoding;
  BlockBuilder meta_index_block;
  BlockHandle local_128;
  BlockHandle local_118;
  BlockHandle local_108;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  Slice local_b8;
  undefined1 local_a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_90 [5];
  Slice local_40;
  
  options = in_RSI->rep_;
  Flush(in_RSI);
  if (options->closed != true) {
    options->closed = true;
    local_108.offset_._0_4_ = 0xffffffff;
    local_108.offset_._4_4_ = 0xffffffff;
    local_108.size_._0_4_ = 0xffffffff;
    local_108.size_._4_4_ = 0xffffffff;
    local_118.offset_._0_4_ = 0xffffffff;
    local_118.offset_._4_4_ = 0xffffffff;
    local_118.size_._0_4_ = 0xffffffff;
    local_118.size_._4_4_ = 0xffffffff;
    local_128.offset_._0_4_ = 0xffffffff;
    local_128.offset_._4_4_ = 0xffffffff;
    local_128.size_._0_4_ = 0xffffffff;
    local_128.size_._4_4_ = 0xffffffff;
    bVar3 = ok(in_RSI);
    if ((bVar3) && (options->filter_block != (FilterBlockBuilder *)0x0)) {
      local_a8._0_16_ = (undefined1  [16])FilterBlockBuilder::Finish(options->filter_block);
      WriteRawBlock(in_RSI,(Slice *)local_a8,kNoCompression,&local_108);
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      BlockBuilder::BlockBuilder((BlockBuilder *)local_a8,&options->options);
      if (options->filter_block != (FilterBlockBuilder *)0x0) {
        std::__cxx11::string::string((string *)local_f8,"filter.",(allocator *)local_d8);
        (*((options->options).filter_policy)->_vptr_FilterPolicy[2])();
        std::__cxx11::string::append((char *)local_f8);
        local_d8._0_8_ = local_d8 + 0x10;
        local_d8._8_8_ = (pointer)0x0;
        local_d8[0x10] = '\0';
        BlockHandle::EncodeTo(&local_108,(string *)local_d8);
        local_b8.data_ = (char *)local_f8._0_8_;
        local_b8.size_ = local_f8._8_8_;
        local_40.data_ = (char *)local_d8._0_8_;
        local_40.size_ = local_d8._8_8_;
        BlockBuilder::Add((BlockBuilder *)local_a8,&local_b8,&local_40);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
      WriteBlock(in_RSI,(BlockBuilder *)local_a8,&local_118);
      BlockBuilder::~BlockBuilder((BlockBuilder *)local_a8);
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      if (options->pending_index_entry == true) {
        pCVar1 = (options->options).comparator;
        (*pCVar1->_vptr_Comparator[5])(pCVar1,&options->last_key);
        local_a8._8_8_ = 0;
        local_a8._0_8_ = local_a8 + 0x10;
        local_a8._16_8_ = local_a8._16_8_ & 0xffffffffffffff00;
        BlockHandle::EncodeTo(&options->pending_handle,(string *)local_a8);
        local_f8._0_8_ = (options->last_key)._M_dataplus._M_p;
        local_f8._8_8_ = (options->last_key)._M_string_length;
        local_d8._0_8_ = local_a8._0_8_;
        local_d8._8_8_ = local_a8._8_8_;
        BlockBuilder::Add(&options->index_block,(Slice *)local_f8,(Slice *)local_d8);
        options->pending_index_entry = false;
        std::__cxx11::string::_M_dispose();
      }
      WriteBlock(in_RSI,&options->index_block,&local_128);
    }
    bVar3 = ok(in_RSI);
    if (bVar3) {
      local_a8._4_4_ = local_118.offset_._4_4_;
      local_a8._0_4_ = (undefined4)local_118.offset_;
      local_a8._12_4_ = local_118.size_._4_4_;
      local_a8._8_4_ = (undefined4)local_118.size_;
      local_a8._16_8_ = CONCAT44(local_128.offset_._4_4_,(undefined4)local_128.offset_);
      aaStack_90[0]._0_8_ = CONCAT44(local_128.size_._4_4_,(undefined4)local_128.size_);
      local_f8._0_8_ = local_f8 + 0x10;
      local_f8._8_8_ = (pointer)0x0;
      local_f8[0x10] = '\0';
      Footer::EncodeTo((Footer *)local_a8,(string *)local_f8);
      local_d8._0_8_ = local_f8._0_8_;
      local_d8._8_8_ = local_f8._8_8_;
      (*options->file->_vptr_WritableFile[2])(&local_b8);
      pOVar2 = (Options *)(options->status).state_;
      (options->status).state_ = local_b8.data_;
      local_b8.data_ = (char *)pOVar2;
      Status::~Status((Status *)&local_b8);
      if ((options->status).state_ == (char *)0x0) {
        options->offset = (uint64_t)(local_f8._8_8_ + options->offset);
      }
      std::__cxx11::string::_M_dispose();
    }
    Status::Status((Status *)this,&options->status);
    return (Status)(char *)this;
  }
  __assert_fail("!r->closed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_builder.cc"
                ,0xc9,"Status leveldb::TableBuilder::Finish()");
}

Assistant:

Status TableBuilder::Finish() {
  Rep* r = rep_;
  Flush();
  assert(!r->closed);
  r->closed = true;

  BlockHandle filter_block_handle, metaindex_block_handle, index_block_handle;

  // Write filter block
  if (ok() && r->filter_block != nullptr) {
    WriteRawBlock(r->filter_block->Finish(), kNoCompression,
                  &filter_block_handle);
  }

  // Write metaindex block
  if (ok()) {
    BlockBuilder meta_index_block(&r->options);
    if (r->filter_block != nullptr) {
      // Add mapping from "filter.Name" to location of filter data
      std::string key = "filter.";
      key.append(r->options.filter_policy->Name());
      std::string handle_encoding;
      filter_block_handle.EncodeTo(&handle_encoding);
      meta_index_block.Add(key, handle_encoding);
    }

    // TODO(postrelease): Add stats and other meta blocks
    WriteBlock(&meta_index_block, &metaindex_block_handle);
  }

  // Write index block
  if (ok()) {
    if (r->pending_index_entry) {
      r->options.comparator->FindShortSuccessor(&r->last_key);
      std::string handle_encoding;
      r->pending_handle.EncodeTo(&handle_encoding);
      r->index_block.Add(r->last_key, Slice(handle_encoding));
      r->pending_index_entry = false;
    }
    WriteBlock(&r->index_block, &index_block_handle);
  }

  // Write footer
  if (ok()) {
    Footer footer;
    footer.set_metaindex_handle(metaindex_block_handle);
    footer.set_index_handle(index_block_handle);
    std::string footer_encoding;
    footer.EncodeTo(&footer_encoding);
    r->status = r->file->Append(footer_encoding);
    if (r->status.ok()) {
      r->offset += footer_encoding.size();
    }
  }
  return r->status;
}